

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall ParserTest_serialize_Test::TestBody(ParserTest_serialize_Test *this)

{
  char *pcVar1;
  internal local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [32];
  string local_78 [16];
  long local_68 [2];
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  
  jessilib::object::object((object *)&local_58._M_first,(uchar *)"test_data");
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>(local_78,"test","");
  jessilib::serialize_object((object *)local_98,(string *)&local_58._M_first);
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[10]>
            (local_a8,"serialize_object(u8\"test_data\", \"test\")","u8\"test_data\"",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_98,
             (char8_t (*) [10])"test_data");
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58._M_first);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
               ,0xa1,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_98,(Message *)&local_58._M_first);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_58._M_first._M_storage != (void *)0x0) {
      (**(code **)(*(long *)local_58._M_first._M_storage + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  return;
}

Assistant:

TEST_F(ParserTest, serialize) {
	EXPECT_EQ(serialize_object(u8"test_data", "test"), u8"test_data");
}